

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprc_node_common1(lys_ypr_ctx *pctx,lysc_node *node,ly_bool *flag)

{
  ly_out *out;
  ly_stmt substmt;
  char *pcVar1;
  char *pcVar2;
  lysc_when **pplVar3;
  lysc_when *local_60;
  uint local_3c;
  lysc_when **when;
  uint64_t u;
  ly_bool *flag_local;
  lysc_node *node_local;
  lys_ypr_ctx *pctx_local;
  
  out = (pctx->field_0).field_0.out;
  if (((pctx->field_0).field_0.options & 2) == 0) {
    local_3c = (uint)(pctx->field_0).field_0.level << 1;
  }
  else {
    local_3c = 0;
  }
  pcVar1 = lys_nodetype2str(node->nodetype);
  pcVar2 = " {\n";
  if (flag != (ly_bool *)0x0) {
    pcVar2 = "";
  }
  ly_print_(out,"%*s%s %s%s",(ulong)local_3c,"",pcVar1,node->name,pcVar2);
  (pctx->field_0).field_0.level = (pctx->field_0).field_0.level + 1;
  substmt = lyplg_ext_nodetype2stmt(node->nodetype);
  yprc_extension_instances(pctx,substmt,'\0',node->exts,flag);
  pplVar3 = lysc_node_when(node);
  when = (lysc_when **)0x0;
  while( true ) {
    if (pplVar3 == (lysc_when **)0x0) {
      local_60 = (lysc_when *)0x0;
    }
    else {
      local_60 = pplVar3[-1];
    }
    if (local_60 <= when) break;
    yprc_when(pctx,pplVar3[(long)when],flag);
    when = (lysc_when **)((long)when + 1);
  }
  return;
}

Assistant:

static void
yprc_node_common1(struct lys_ypr_ctx *pctx, const struct lysc_node *node, ly_bool *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_when **when;

    ly_print_(pctx->out, "%*s%s %s%s", INDENT, lys_nodetype2str(node->nodetype), node->name, flag ? "" : " {\n");
    LEVEL++;

    yprc_extension_instances(pctx, lyplg_ext_nodetype2stmt(node->nodetype), 0, node->exts, flag);

    when = lysc_node_when(node);
    LY_ARRAY_FOR(when, u) {
        yprc_when(pctx, when[u], flag);
    }
}